

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O3

void nn_bipc_start_listening(nn_bipc *self)

{
  nn_usock *self_00;
  uint __fd;
  int iVar1;
  char *__s;
  size_t sVar2;
  uint *puVar3;
  nn_aipc *self_01;
  nn_fsm *owner;
  nn_fsm *self_02;
  sockaddr local_a0 [6];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  __s = nn_epbase_getaddr(&self->epbase);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  sVar2 = strlen(__s);
  if (0x6b < sVar2) {
    nn_bipc_start_listening_cold_4();
    goto LAB_0012a793;
  }
  local_a0[0].sa_family = 1;
  strncpy(local_a0[0].sa_data,__s,0x6c);
  __fd = socket(1,1,0);
  if ((int)__fd < 0) {
LAB_0012a71d:
    self_00 = &self->usock;
    iVar1 = nn_usock_start(self_00,1,1,0);
    if (-1 < iVar1) {
      iVar1 = nn_usock_bind(self_00,(sockaddr *)local_a0,0x6e);
      if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,10), -1 < iVar1)) {
        nn_bipc_start_accepting(self);
        self->state = 2;
        return;
      }
      nn_usock_stop(self_00);
      self->state = 8;
      return;
    }
LAB_0012a793:
    nn_backoff_start(&self->retry);
    self->state = 7;
    return;
  }
  iVar1 = fcntl(__fd,4,0x800);
  if (iVar1 == -1) {
    puVar3 = (uint *)__errno_location();
    owner = (nn_fsm *)(ulong)*puVar3;
    if (*puVar3 == 0x16) goto LAB_0012a6d3;
  }
  else {
LAB_0012a6d3:
    iVar1 = connect(__fd,local_a0,0x6e);
    if ((((iVar1 == -1) && (puVar3 = (uint *)__errno_location(), *puVar3 == 0x6f)) &&
        (iVar1 = unlink(__s), iVar1 != 0)) && (owner = (nn_fsm *)(ulong)*puVar3, *puVar3 != 2))
    goto LAB_0012a7b5;
    owner = (nn_fsm *)(ulong)__fd;
    iVar1 = close(__fd);
    if (iVar1 == 0) goto LAB_0012a71d;
    nn_bipc_start_listening_cold_3();
  }
  nn_bipc_start_listening_cold_1();
LAB_0012a7b5:
  nn_bipc_start_listening_cold_2();
  if (owner[8].owner == (nn_fsm *)0x0) {
    self_02 = (nn_fsm *)0x740;
    self_01 = (nn_aipc *)nn_alloc_(0x740);
    owner[8].owner = (nn_fsm *)self_01;
    if (self_01 != (nn_aipc *)0x0) {
      nn_aipc_init(self_01,2,(nn_epbase *)&owner[1].shutdown_fn,owner);
      nn_aipc_start((nn_aipc *)owner[8].owner,(nn_usock *)&owner[1].srcptr);
      return;
    }
  }
  else {
    nn_bipc_start_accepting_cold_1();
    self_02 = owner;
  }
  nn_bipc_start_accepting_cold_2();
  if (self_02 != (nn_fsm *)0x0) {
    self_02 = (nn_fsm *)&self_02[-2].stopped.item;
  }
  nn_fsm_stop(self_02);
  return;
}

Assistant:

static void nn_bipc_start_listening (struct nn_bipc *self)
{
    int rc;
    struct sockaddr_storage ss;
    struct sockaddr_un *un;
    const char *addr;
#if !defined NN_HAVE_WINDOWS
    int fd;
#endif

    /*  First, create the AF_UNIX address. */
    addr = nn_epbase_getaddr (&self->epbase);
    memset (&ss, 0, sizeof (ss));
    un = (struct sockaddr_un*) &ss;
    nn_assert (strlen (addr) < sizeof (un->sun_path));
    ss.ss_family = AF_UNIX;
    strncpy (un->sun_path, addr, sizeof (un->sun_path));

    /*  Delete the IPC file left over by eventual previous runs of
        the application. We'll check whether the file is still in use by
        connecting to the endpoint. On Windows plaform, NamedPipe is used
        which does not have an underlying file. */
#if !defined NN_HAVE_WINDOWS
    fd = socket (AF_UNIX, SOCK_STREAM, 0);
    if (fd >= 0) {
        rc = fcntl (fd, F_SETFL, O_NONBLOCK);
        errno_assert (rc != -1 || errno == EINVAL);
        rc = connect (fd, (struct sockaddr*) &ss,
            sizeof (struct sockaddr_un));
        if (rc == -1 && errno == ECONNREFUSED) {
            rc = unlink (addr);
            errno_assert (rc == 0 || errno == ENOENT);
        }
        rc = close (fd);
        errno_assert (rc == 0);
    }
#endif

    /*  Start listening for incoming connections. */
    rc = nn_usock_start (&self->usock, AF_UNIX, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_BIPC_STATE_WAITING;
        return;
    }

    rc = nn_usock_bind (&self->usock,
        (struct sockaddr*) &ss, sizeof (struct sockaddr_un));
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BIPC_STATE_CLOSING;
        return;
    }

    rc = nn_usock_listen (&self->usock, NN_BIPC_BACKLOG);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BIPC_STATE_CLOSING;
        return;
    }
    nn_bipc_start_accepting (self);
    self->state = NN_BIPC_STATE_ACTIVE;
}